

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QTransform * __thiscall
QGraphicsItemPrivate::genericMapFromSceneTransform
          (QTransform *__return_storage_ptr__,QGraphicsItemPrivate *this,QWidget *viewport)

{
  long lVar1;
  QGraphicsItem *this_00;
  QGraphicsView *this_01;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  long in_FS_OFFSET;
  byte bVar5;
  QTransform QStack_118;
  bool local_c8 [80];
  QTransform viewportTransform;
  
  bVar5 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(uint *)&this->field_0x161 & 0x20000400) != 0) && (viewport != (QWidget *)0x0)) {
    this_00 = this->q_ptr;
    this_01 = (QGraphicsView *)
              QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>
                        (*(QObject **)(*(long *)&viewport->field_0x8 + 0x10));
    if (this_01 != (QGraphicsView *)0x0) {
      pqVar3 = (qreal *)&DAT_00677848;
      pQVar4 = &viewportTransform;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        pQVar4->m_matrix[0][0] = *pqVar3;
        pqVar3 = pqVar3 + (ulong)bVar5 * -2 + 1;
        pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      QGraphicsView::viewportTransform(&viewportTransform,this_01);
      QGraphicsItem::deviceTransform(&QStack_118,this_00,&viewportTransform);
      QTransform::inverted(local_c8);
      QTransform::operator*(__return_storage_ptr__,&viewportTransform);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_005702d1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QTransform::inverted((bool *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
LAB_005702d1:
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsItemPrivate::genericMapFromSceneTransform(const QWidget *viewport) const
{
    Q_Q(const QGraphicsItem);
    if (!itemIsUntransformable())
       return sceneTransform.inverted();
    const QGraphicsView *view = viewport
        ? qobject_cast<QGraphicsView *>(viewport->parentWidget())
        : nullptr;
    if (view == nullptr)
        return sceneTransform.inverted();
    // ### More ping pong than needed.
    const QTransform viewportTransform = view->viewportTransform();
    return viewportTransform * q->deviceTransform(viewportTransform).inverted();
}